

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O3

void __thiscall
icu_63::OlsonTimeZone::getHistoricalOffset
          (OlsonTimeZone *this,UDate date,UBool local,int32_t NonExistingTimeOpt,
          int32_t DuplicatedTimeOpt,int32_t *rawoff,int32_t *dstoff)

{
  ulong uVar1;
  byte bVar2;
  uint8_t *puVar3;
  int iVar4;
  uint uVar5;
  int64_t iVar6;
  long lVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  ushort uVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  double dVar18;
  
  uVar14 = this->transitionCount32 + this->transitionCountPre32 + this->transitionCountPost32;
  if (((short)uVar14 < 1) ||
     ((dVar18 = uprv_floor_63(date / 1000.0), local == '\0' &&
      (iVar6 = transitionTimeInSeconds(this,0), dVar18 < (double)iVar6)))) {
    piVar8 = this->typeOffsets;
    *rawoff = *piVar8 * 1000;
    piVar8 = piVar8 + 1;
  }
  else {
    piVar8 = this->typeOffsets;
    puVar3 = this->typeMapData;
    uVar5 = NonExistingTimeOpt & 3;
    uVar13 = DuplicatedTimeOpt & 3;
    uVar15 = (ulong)uVar14;
    do {
      if ((short)uVar15 < 1) {
        *rawoff = *piVar8 * 1000;
        lVar7 = 1;
        goto LAB_002025cc;
      }
      uVar1 = uVar15 - 1;
      lVar7 = transitionTimeInSeconds(this,(short)uVar15 + -1);
      if ((local != '\0') && ((double)(lVar7 + -0x15180) <= dVar18)) {
        if (uVar15 == 1) {
          iVar9 = piVar8[1] + *piVar8;
          lVar12 = 1;
        }
        else {
          bVar2 = puVar3[(int)uVar15 + 0xfffeU & 0xffff];
          iVar9 = piVar8[(ulong)bVar2 * 2 + 1] + *(int *)((long)piVar8 + (ulong)((uint)bVar2 * 8));
          lVar12 = (ulong)bVar2 * 2 + 1;
        }
        bVar16 = piVar8[lVar12] != 0;
        iVar11 = *(int *)((long)piVar8 + (ulong)((uint)puVar3[uVar1 & 0xffff] * 8)) +
                 piVar8[(ulong)puVar3[uVar1 & 0xffff] * 2 + 1];
        bVar17 = piVar8[(ulong)puVar3[uVar1 & 0xffff] * 2 + 1] == 0;
        if (iVar11 < iVar9) {
          iVar10 = iVar11;
          if ((uVar13 != 1 || (!bVar17 || !bVar16)) && (uVar13 != 3 || (bVar17 || bVar16))) {
            if ((DuplicatedTimeOpt & 0xcU) == 4) {
              iVar11 = iVar9;
            }
            iVar4 = iVar11;
            if (bVar17 && bVar16) {
              iVar4 = iVar9;
            }
            if (uVar13 != 3) {
              iVar4 = iVar11;
            }
            if (bVar17 || bVar16) {
              iVar9 = iVar4;
            }
            iVar10 = iVar9;
            if (uVar13 != 1) {
              iVar10 = iVar4;
            }
          }
        }
        else {
          iVar10 = iVar9;
          if ((uVar5 != 1 || (!bVar17 || !bVar16)) && (uVar5 != 3 || (bVar17 || bVar16))) {
            if ((NonExistingTimeOpt & 0xcU) != 0xc) {
              iVar9 = iVar11;
            }
            iVar4 = iVar9;
            if (bVar17 && bVar16) {
              iVar4 = iVar11;
            }
            if (uVar5 != 3) {
              iVar4 = iVar9;
            }
            if (bVar17 || bVar16) {
              iVar11 = iVar4;
            }
            iVar10 = iVar11;
            if (uVar5 != 1) {
              iVar10 = iVar4;
            }
          }
        }
        lVar7 = lVar7 + iVar10;
      }
      uVar15 = uVar1;
    } while (dVar18 < (double)lVar7);
    *rawoff = piVar8[(ulong)puVar3[uVar1 & 0xffff] * 2] * 1000;
    lVar7 = (ulong)puVar3[uVar1 & 0xffff] * 2 + 1;
LAB_002025cc:
    piVar8 = piVar8 + lVar7;
  }
  *dstoff = *piVar8 * 1000;
  return;
}

Assistant:

void
OlsonTimeZone::getHistoricalOffset(UDate date, UBool local,
                                   int32_t NonExistingTimeOpt, int32_t DuplicatedTimeOpt,
                                   int32_t& rawoff, int32_t& dstoff) const {
    U_DEBUG_TZ_MSG(("getHistoricalOffset(%.1f, %s, %d, %d, raw, dst)\n",
        date, local?"T":"F", NonExistingTimeOpt, DuplicatedTimeOpt));
#if defined U_DEBUG_TZ
        printTime(date*1000.0);
#endif
    int16_t transCount = transitionCount();

    if (transCount > 0) {
        double sec = uprv_floor(date / U_MILLIS_PER_SECOND);
        if (!local && sec < transitionTimeInSeconds(0)) {
            // Before the first transition time
            rawoff = initialRawOffset() * U_MILLIS_PER_SECOND;
            dstoff = initialDstOffset() * U_MILLIS_PER_SECOND;
        } else {
            // Linear search from the end is the fastest approach, since
            // most lookups will happen at/near the end.
            int16_t transIdx;
            for (transIdx = transCount - 1; transIdx >= 0; transIdx--) {
                int64_t transition = transitionTimeInSeconds(transIdx);

                if (local && (sec >= (transition - MAX_OFFSET_SECONDS))) {
                    int32_t offsetBefore = zoneOffsetAt(transIdx - 1);
                    UBool dstBefore = dstOffsetAt(transIdx - 1) != 0;

                    int32_t offsetAfter = zoneOffsetAt(transIdx);
                    UBool dstAfter = dstOffsetAt(transIdx) != 0;

                    UBool dstToStd = dstBefore && !dstAfter;
                    UBool stdToDst = !dstBefore && dstAfter;
                    
                    if (offsetAfter - offsetBefore >= 0) {
                        // Positive transition, which makes a non-existing local time range
                        if (((NonExistingTimeOpt & kStdDstMask) == kStandard && dstToStd)
                                || ((NonExistingTimeOpt & kStdDstMask) == kDaylight && stdToDst)) {
                            transition += offsetBefore;
                        } else if (((NonExistingTimeOpt & kStdDstMask) == kStandard && stdToDst)
                                || ((NonExistingTimeOpt & kStdDstMask) == kDaylight && dstToStd)) {
                            transition += offsetAfter;
                        } else if ((NonExistingTimeOpt & kFormerLatterMask) == kLatter) {
                            transition += offsetBefore;
                        } else {
                            // Interprets the time with rule before the transition,
                            // default for non-existing time range
                            transition += offsetAfter;
                        }
                    } else {
                        // Negative transition, which makes a duplicated local time range
                        if (((DuplicatedTimeOpt & kStdDstMask) == kStandard && dstToStd)
                                || ((DuplicatedTimeOpt & kStdDstMask) == kDaylight && stdToDst)) {
                            transition += offsetAfter;
                        } else if (((DuplicatedTimeOpt & kStdDstMask) == kStandard && stdToDst)
                                || ((DuplicatedTimeOpt & kStdDstMask) == kDaylight && dstToStd)) {
                            transition += offsetBefore;
                        } else if ((DuplicatedTimeOpt & kFormerLatterMask) == kFormer) {
                            transition += offsetBefore;
                        } else {
                            // Interprets the time with rule after the transition,
                            // default for duplicated local time range
                            transition += offsetAfter;
                        }
                    }
                }
                if (sec >= transition) {
                    break;
                }
            }
            // transIdx could be -1 when local=true
            rawoff = rawOffsetAt(transIdx) * U_MILLIS_PER_SECOND;
            dstoff = dstOffsetAt(transIdx) * U_MILLIS_PER_SECOND;
        }
    } else {
        // No transitions, single pair of offsets only
        rawoff = initialRawOffset() * U_MILLIS_PER_SECOND;
        dstoff = initialDstOffset() * U_MILLIS_PER_SECOND;
    }
    U_DEBUG_TZ_MSG(("getHistoricalOffset(%.1f, %s, %d, %d, raw, dst) - raw=%d, dst=%d\n",
        date, local?"T":"F", NonExistingTimeOpt, DuplicatedTimeOpt, rawoff, dstoff));
}